

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void do_cmd_buy(command *cmd)

{
  uint32_t *puVar1;
  byte bVar2;
  player_upkeep *ppVar3;
  player *p;
  _Bool _Var4;
  wchar_t wVar5;
  uint32_t uVar6;
  store *store;
  object *dest;
  int iVar7;
  char *fmt;
  object *bought;
  object *obj;
  wchar_t amt;
  char o_name [80];
  object *local_90;
  object *local_88;
  wchar_t local_7c;
  char local_78 [88];
  
  store = store_at((chunk_conflict2 *)cave,player->grid);
  if (store == (store *)0x0) {
    msg("You cannot purchase items when not in a store.");
    return;
  }
  wVar5 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_88);
  if (wVar5 == L'\0') {
    _Var4 = pile_contains(store->stock,local_88);
    if (_Var4) {
      wVar5 = cmd_get_arg_number((command_conflict *)cmd,"quantity",&local_7c);
      if (wVar5 == L'\0') {
        local_90 = object_new();
        object_copy_amt(local_90,local_88,local_7c);
        bVar2 = local_90->number;
        wVar5 = inven_carry_num(player,local_90);
        if (wVar5 < (int)(uint)bVar2) {
          fmt = "You cannot carry that many items.";
        }
        else {
          object_desc(local_78,0x50,local_90,0x43,player);
          wVar5 = price_item(store,local_90,false,(uint)local_90->number);
          p = player;
          if (wVar5 <= player->au) {
            player->au = player->au - wVar5;
            ppVar3 = p->upkeep;
            puVar1 = &ppVar3->update;
            *puVar1 = *puVar1 | 0x400;
            puVar1 = &ppVar3->notice;
            *(byte *)puVar1 = (byte)*puVar1 | 3;
            object_desc(local_78,0x50,local_90,0x43,p);
            uVar6 = Rand_div(3);
            if (uVar6 == 0) {
              uVar6 = Rand_div(6);
              msgt(0x56,"%s",
                   comment_accept_rel + *(int *)(comment_accept_rel + (long)(int)uVar6 * 4));
            }
            msg("You bought %s for %d gold.",local_78,(ulong)(uint)wVar5);
            local_90->note = 0;
            if (local_90->origin == '\0') {
              local_90->origin = '\x10';
            }
            _Var4 = tval_can_have_charges(local_88);
            if (_Var4) {
              local_88->pval = local_88->pval - local_90->pval;
            }
            dest = object_new();
            object_copy(dest,local_88->known);
            local_90->known = dest;
            object_flavor_aware(player,local_90);
            local_90->known->effect = local_90->effect;
            while (_Var4 = object_fully_known(local_90), !_Var4) {
              object_learn_unknown_rune(player,local_90,true);
              player_know_object(player,local_90);
            }
            inven_carry(player,local_90,true,true);
            handle_stuff(player);
            _Var4 = store_sale_should_reduce_stock(store,local_88);
            if ((_Var4) && (store_delete(store,local_88,local_7c), store->stock_num == '\0')) {
              uVar6 = Rand_div((uint)z_info->store_shuffle);
              if (uVar6 == 0) {
                msg("The shopkeeper retires.");
                store_shuffle(store);
              }
              else {
                msg("The shopkeeper brings out some new stock.");
              }
              iVar7 = 10;
              do {
                store_maint(store);
                iVar7 = iVar7 + -1;
              } while (iVar7 != 0);
            }
            event_signal(EVENT_STORECHANGED);
            event_signal(EVENT_INVENTORY);
            event_signal(EVENT_EQUIPMENT);
            return;
          }
          fmt = "You cannot afford that purchase.";
        }
        msg(fmt);
        object_delete((chunk *)0x0,(chunk *)0x0,&local_90);
      }
    }
    else {
      msg("You cannot buy that item because it\'s not in the store.");
    }
  }
  return;
}

Assistant:

void do_cmd_buy(struct command *cmd)
{
	int amt;

	struct object *obj, *bought, *known_obj;

	char o_name[80];
	int price;

	struct store *store = store_at(cave, player->grid);

	if (!store) {
		msg("You cannot purchase items when not in a store.");
		return;
	}

	/* Get arguments */
	/* XXX-AS fill this out, split into cmd-store.c */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (!pile_contains(store->stock, obj)) {
		msg("You cannot buy that item because it's not in the store.");
		return;
	}

	if (cmd_get_arg_number(cmd, "quantity", &amt) != CMD_OK)
		return;

	/* Get desired object */
	bought = object_new();
	object_copy_amt(bought, obj, amt);

	/* Ensure we have room */
	if (bought->number > inven_carry_num(player, bought)) {
		msg("You cannot carry that many items.");
		object_delete(NULL, NULL, &bought);
		return;
	}

	/* Describe the object (fully) */
	object_desc(o_name, sizeof(o_name), bought, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Extract the price for the entire stack */
	price = price_item(store, bought, false, bought->number);

	if (price > player->au) {
		msg("You cannot afford that purchase.");
		object_delete(NULL, NULL, &bought);
		return;
	}

	/* Spend the money */
	player->au -= price;

	/* Update the gear */
	player->upkeep->update |= (PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE | PN_IGNORE);

	/* Describe the object (fully) again for the message */
	object_desc(o_name, sizeof(o_name), bought, ODESC_PREFIX | ODESC_FULL,
		player);

	/* Message */
	if (one_in_(3)) msgt(MSG_STORE5, "%s", ONE_OF(comment_accept));
	msg("You bought %s for %d gold.", o_name, price);

	/* Erase the inscription */
	bought->note = 0;

	/* Give it an origin if it doesn't have one */
	if (bought->origin == ORIGIN_NONE)
		bought->origin = ORIGIN_STORE;

	/* Hack - Reduce the number of charges in the original stack */
	if (tval_can_have_charges(obj))
		obj->pval -= bought->pval;

	/* Make a known object */
	known_obj = object_new();
	object_copy(known_obj, obj->known);
	bought->known = known_obj;

	/* Learn flavor, any effect and all the runes */
	object_flavor_aware(player, bought);
	bought->known->effect = bought->effect;
	while (!object_fully_known(bought)) {
		object_learn_unknown_rune(player, bought, true);
		player_know_object(player, bought);
	}

	/* Give it to the player */
	inven_carry(player, bought, true, true);

	/* Handle stuff */
	handle_stuff(player);

	/* Remove the bought objects from the store if it's not a readily
	 * replaced staple item */
	if (store_sale_should_reduce_stock(store, obj)) {
		/* Reduce or remove the item */
		store_delete(store, obj, amt);

		/* Store is empty */
		if (store->stock_num == 0) {
			int i;

			/* Sometimes shuffle the shopkeeper */
			if (one_in_(z_info->store_shuffle)) {
				/* Shuffle */
				msg("The shopkeeper retires.");
				store_shuffle(store);
			} else
				/* Maintain */
				msg("The shopkeeper brings out some new stock.");

			/* New inventory */
			for (i = 0; i < 10; ++i)
				store_maint(store);
		}
	}

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}